

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

void __thiscall
icu_63::IslamicCalendar::handleComputeFields
          (IslamicCalendar *this,int32_t julianDay,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  int32_t iVar4;
  int64_t iVar5;
  double dVar6;
  UDate time;
  double dVar7;
  int32_t local_80;
  int32_t local_78;
  int local_64;
  long lStack_60;
  int monthLen;
  long d;
  uint local_50;
  int m;
  int y;
  int32_t umalquraStartdays;
  double age;
  int local_38;
  int32_t months;
  int32_t days;
  int32_t startDate;
  int32_t dayOfYear;
  int32_t dayOfMonth;
  int32_t month;
  int32_t year;
  UErrorCode *status_local;
  int32_t julianDay_local;
  IslamicCalendar *this_local;
  
  local_38 = julianDay + -0x1dbb18;
  if ((*(int *)&(this->super_Calendar).field_0x264 == 1) ||
     (*(int *)&(this->super_Calendar).field_0x264 == 3)) {
    if (*(int *)&(this->super_Calendar).field_0x264 == 3) {
      local_38 = julianDay + -0x1dbb17;
    }
    iVar5 = ClockMath::floorDivide((long)local_38 * 0x1e + 0x2996,0x2987);
    dayOfMonth = (int32_t)iVar5;
    iVar2 = yearStart(this,dayOfMonth);
    dVar6 = uprv_ceil_63((double)((local_38 + -0x1d) - iVar2) / 29.5);
    local_78 = (int32_t)dVar6;
    if (10 < local_78) {
      local_78 = 0xb;
    }
    dayOfYear = local_78;
    monthStart(this,dayOfMonth,local_78);
  }
  else if (*(int *)&(this->super_Calendar).field_0x264 == 0) {
    dVar6 = uprv_floor_63((double)local_38 / 29.530588853);
    age._4_4_ = (int)dVar6;
    dVar6 = uprv_floor_63((double)age._4_4_ * 29.530588853);
    time = Calendar::internalGetTime(&this->super_Calendar);
    dVar7 = moonAge(time,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    if ((0x18 < local_38 - (int)dVar6) && (0.0 < dVar7)) {
      age._4_4_ = age._4_4_ + 1;
    }
    while (iVar2 = trueMonthStart(this,age._4_4_), local_38 < iVar2) {
      age._4_4_ = age._4_4_ + -1;
    }
    dayOfMonth = age._4_4_ / 0xc + 1;
    dayOfYear = age._4_4_ % 0xc;
  }
  else if (*(int *)&(this->super_Calendar).field_0x264 == 2) {
    iVar2 = yearStart(this,0x514);
    if (local_38 < iVar2) {
      dVar6 = ClockMath::floorDivide((double)(local_38 * 0x1e + 0x2996),10631.0);
      dayOfMonth = (int32_t)dVar6;
      iVar2 = yearStart(this,dayOfMonth);
      dVar6 = uprv_ceil_63((double)((julianDay + -0x1dbb35) - iVar2) / 29.5);
      local_80 = (int32_t)dVar6;
      if (10 < local_80) {
        local_80 = 0xb;
      }
      dayOfYear = local_80;
      monthStart(this,dayOfMonth,local_80);
    }
    else {
      local_50 = 0x513;
      d._4_4_ = 0;
      lStack_60 = 1;
      do {
        if (lStack_60 < 1) goto LAB_00224769;
        local_50 = local_50 + 1;
        iVar2 = yearStart(this,local_50);
        lStack_60 = (long)((local_38 - iVar2) + 1);
        iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)local_50);
        if (lStack_60 == iVar3) {
          d._4_4_ = 0xb;
          goto LAB_00224769;
        }
        iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)local_50);
      } while (iVar3 <= lStack_60);
      local_64 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])(this,(ulong)local_50,0)
      ;
      d._4_4_ = 0;
      while (local_64 < lStack_60) {
        lStack_60 = lStack_60 - local_64;
        d._4_4_ = d._4_4_ + 1;
        local_64 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])
                             (this,(ulong)local_50,(ulong)d._4_4_);
      }
LAB_00224769:
      dayOfMonth = local_50;
      dayOfYear = d._4_4_;
    }
  }
  else {
    dayOfYear = 0;
    dayOfMonth = 0;
  }
  iVar2 = monthStart(this,dayOfMonth,dayOfYear);
  iVar4 = monthStart(this,dayOfMonth,0);
  Calendar::internalSet(&this->super_Calendar,UCAL_ERA,0);
  Calendar::internalSet(&this->super_Calendar,UCAL_YEAR,dayOfMonth);
  Calendar::internalSet(&this->super_Calendar,UCAL_EXTENDED_YEAR,dayOfMonth);
  Calendar::internalSet(&this->super_Calendar,UCAL_MONTH,dayOfYear);
  Calendar::internalSet(&this->super_Calendar,UCAL_DATE,(local_38 - iVar2) + 1);
  Calendar::internalSet(&this->super_Calendar,UCAL_DAY_OF_YEAR,(local_38 - iVar4) + 1);
  return;
}

Assistant:

void IslamicCalendar::handleComputeFields(int32_t julianDay, UErrorCode &status) {
    int32_t year, month, dayOfMonth, dayOfYear;
    int32_t startDate;
    int32_t days = julianDay - CIVIL_EPOC;

    if (cType == CIVIL || cType == TBLA) {
        if(cType == TBLA) {
            days = julianDay - ASTRONOMICAL_EPOC;
        }
        // Use the civil calendar approximation, which is just arithmetic
        year  = (int32_t)ClockMath::floorDivide(30 * (int64_t)days + 10646, (int64_t)10631);
        month = (int32_t)uprv_ceil((days - 29 - yearStart(year)) / 29.5 );
        month = month<11?month:11;
        startDate = monthStart(year, month);
    } else if(cType == ASTRONOMICAL){
        // Guess at the number of elapsed full months since the epoch
        int32_t months = (int32_t)uprv_floor((double)days / CalendarAstronomer::SYNODIC_MONTH);

        startDate = (int32_t)uprv_floor(months * CalendarAstronomer::SYNODIC_MONTH);

        double age = moonAge(internalGetTime(), status);
        if (U_FAILURE(status)) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if ( days - startDate >= 25 && age > 0) {
            // If we're near the end of the month, assume next month and search backwards
            months++;
        }

        // Find out the last time that the new moon was actually visible at this longitude
        // This returns midnight the night that the moon was visible at sunset.
        while ((startDate = trueMonthStart(months)) > days) {
            // If it was after the date in question, back up a month and try again
            months--;
        }

        year = months / 12 + 1;
        month = months % 12;
    } else if(cType == UMALQURA) {
        int32_t umalquraStartdays = yearStart(UMALQURA_YEAR_START) ;
        if( days < umalquraStartdays){
                //Use Civil calculation
                year  = (int)ClockMath::floorDivide( (double)(30 * days + 10646) , 10631.0 );
                month = (int32_t)uprv_ceil((days - 29 - yearStart(year)) / 29.5 );
                month = month<11?month:11;
                startDate = monthStart(year, month);
            }else{
                int y =UMALQURA_YEAR_START-1, m =0;
                long d = 1;
                while(d > 0){ 
                    y++; 
                    d = days - yearStart(y) +1;
                    if(d == handleGetYearLength(y)){
                        m=11;
                        break;
                    }else if(d < handleGetYearLength(y) ){
                        int monthLen = handleGetMonthLength(y, m); 
                        m=0;
                        while(d > monthLen){
                            d -= monthLen;
                            m++;
                            monthLen = handleGetMonthLength(y, m);
                        }
                        break;
                    }
                }
                year = y;
                month = m;
            }
    } else { // invalid 'civil'
      U_ASSERT(false); // should not get here, out of range
      year=month=0;
    }

    dayOfMonth = (days - monthStart(year, month)) + 1;

    // Now figure out the day of the year.
    dayOfYear = (days - monthStart(year, 0)) + 1;


    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);       
}